

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int _c;
  int iVar1;
  
  if ((*(long *)__fn == 0) || (_c = *(int *)(__fn + 0x2c), *(long *)(__fn + 0x30) * (long)_c == 0))
  {
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->elemsize = 0;
    this->allocator = (Allocator *)0x0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->cstep = 0;
  }
  else {
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->cstep = 0;
    this->elemsize = 0;
    this->allocator = (Allocator *)0x0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    iVar1 = *(int *)(__fn + 0x20);
    if (iVar1 == 3) {
      create(this,*(int *)(__fn + 0x24),*(int *)(__fn + 0x28),_c,*(size_t *)(__fn + 0x10),
             (Allocator *)__child_stack);
    }
    else if (iVar1 == 2) {
      create(this,*(int *)(__fn + 0x24),*(int *)(__fn + 0x28),*(size_t *)(__fn + 0x10),
             (Allocator *)__child_stack);
    }
    else if (iVar1 == 1) {
      create(this,*(int *)(__fn + 0x24),*(size_t *)(__fn + 0x10),(Allocator *)__child_stack);
    }
    if ((long)*(int *)(__fn + 0x2c) * *(long *)(__fn + 0x30) != 0) {
      memcpy(this->data,*(void **)__fn,
             (long)*(int *)(__fn + 0x2c) * *(long *)(__fn + 0x30) * *(long *)(__fn + 0x10));
    }
  }
  return (int)this;
}

Assistant:

inline Mat Mat::clone(Allocator* allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, allocator);

    if (total() > 0)
    {
        memcpy(m.data, data, total() * elemsize);
    }

    return m;
}